

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse_context.cc
# Opt level: O2

char * __thiscall
google::protobuf::internal::UnknownFieldLiteParserHelper::ParseGroup
          (UnknownFieldLiteParserHelper *this,uint32_t num,char *ptr,ParseContext *ctx)

{
  int v1;
  undefined4 uVar1;
  undefined4 uVar2;
  uint32_t uVar3;
  char *pcVar4;
  string *psVar5;
  char *pcVar6;
  size_type sVar7;
  undefined8 uVar8;
  uint uVar9;
  int iVar10;
  pointer pcVar11;
  LogMessageFatal local_40 [16];
  
  uVar9 = num * 8 + 3;
  if (this->unknown_ != (string *)0x0) {
    WriteVarint((ulong)uVar9,this->unknown_);
  }
  iVar10 = ctx->depth_;
  v1 = iVar10 + -1;
  ctx->depth_ = v1;
  if (iVar10 < 1) {
    pcVar6 = (char *)0x0;
  }
  else {
    iVar10 = ctx->group_depth_ + 1;
    ctx->group_depth_ = iVar10;
    pcVar4 = WireFormatParser<google::protobuf::internal::UnknownFieldLiteParserHelper>
                       (this,ptr,ctx);
    if (pcVar4 != (char *)0x0) {
      psVar5 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (v1,ctx->depth_,"old_depth == depth_");
      if (psVar5 != (string *)0x0) {
        pcVar11 = (psVar5->_M_dataplus)._M_p;
        sVar7 = psVar5->_M_string_length;
        uVar8 = 0x45b;
LAB_0016cd12:
        absl::lts_20240722::log_internal::LogMessageFatal::LogMessageFatal
                  (local_40,
                   "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O2/_deps/protobuf-src/src/google/protobuf/parse_context.h"
                   ,uVar8,sVar7,pcVar11);
        absl::lts_20240722::log_internal::LogMessageFatal::~LogMessageFatal(local_40);
      }
      psVar5 = absl::lts_20240722::log_internal::Check_EQImpl_abi_cxx11_
                         (iVar10,ctx->group_depth_,"old_group_depth == group_depth_");
      if (psVar5 != (string *)0x0) {
        pcVar11 = (psVar5->_M_dataplus)._M_p;
        sVar7 = psVar5->_M_string_length;
        uVar8 = 0x45c;
        goto LAB_0016cd12;
      }
    }
    uVar3 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    uVar1 = ctx->depth_;
    uVar2 = ctx->group_depth_;
    ctx->depth_ = uVar1 + 1;
    ctx->group_depth_ = uVar2 + -1;
    pcVar6 = (char *)0x0;
    if (((pcVar4 != (char *)0x0) && (uVar3 == uVar9)) &&
       (pcVar6 = pcVar4, this->unknown_ != (string *)0x0)) {
      WriteVarint((ulong)(num << 3 | 4),this->unknown_);
    }
  }
  return pcVar6;
}

Assistant:

const char* ParseGroup(uint32_t num, const char* ptr, ParseContext* ctx) {
    if (unknown_) WriteVarint(num * 8 + 3, unknown_);
    ptr = ctx->ParseGroupInlined(ptr, num * 8 + 3, [&](const char* ptr) {
      return WireFormatParser(*this, ptr, ctx);
    });
    GOOGLE_PROTOBUF_PARSER_ASSERT(ptr);
    if (unknown_) WriteVarint(num * 8 + 4, unknown_);
    return ptr;
  }